

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Slider.cxx
# Opt level: O1

void __thiscall Fl_Slider::draw(Fl_Slider *this,int X,int Y,int W,int H)

{
  double dVar1;
  double dVar2;
  uchar uVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  Fl_Color FVar7;
  _func_int **pp_Var8;
  byte bVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  Fl_Boxtype t;
  uint uVar14;
  int W_00;
  int H_00;
  int H_01;
  int iVar15;
  double dVar16;
  double dVar17;
  int local_68;
  
  dVar1 = (this->super_Fl_Valuator).min;
  dVar2 = (this->super_Fl_Valuator).max;
  if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
    dVar17 = ((this->super_Fl_Valuator).value_ - dVar1) / (dVar2 - dVar1);
    dVar16 = 1.0;
    if ((dVar17 <= 1.0) && (dVar16 = dVar17, dVar17 < 0.0)) {
      dVar16 = 0.0;
    }
  }
  else {
    dVar16 = 0.5;
  }
  bVar9 = (this->super_Fl_Valuator).super_Fl_Widget.type_;
  iVar15 = W;
  if ((bVar9 & 1) == 0) {
    iVar15 = H;
  }
  if ((bVar9 & 0xfe) == 2) {
    H_01 = (int)(dVar16 * (double)iVar15 + 0.5);
    if (dVar1 <= dVar2) {
      local_68 = 0;
    }
    else {
      local_68 = H_01;
      H_01 = iVar15 - H_01;
    }
  }
  else {
    H_01 = (int)((float)iVar15 * *(float *)&(this->super_Fl_Valuator).field_0xa4 + 0.5);
    iVar10 = H;
    if ((bVar9 & 1) == 0) {
      iVar10 = W;
    }
    iVar10 = iVar10 / 2 + (uint)((bVar9 & 0xfe) == 4) * 4 + 1;
    if (H_01 < iVar10) {
      H_01 = iVar10;
    }
    local_68 = (int)(dVar16 * (double)(iVar15 - H_01) + 0.5);
  }
  if ((bVar9 & 1) == 0) {
    local_68 = local_68 + Y;
    iVar15 = X;
    iVar10 = W;
  }
  else {
    iVar15 = local_68 + X;
    iVar10 = H_01;
    H_01 = H;
    local_68 = Y;
  }
  draw_bg(this,X,Y,W,H);
  bVar4 = (this->super_Fl_Valuator).super_Fl_Widget.box_ & 0xfe;
  bVar9 = 2;
  if (bVar4 != 0) {
    bVar9 = bVar4;
  }
  bVar4 = (byte)*(undefined4 *)&this->slider_;
  if (bVar4 != 0) {
    bVar9 = bVar4;
  }
  uVar3 = (this->super_Fl_Valuator).super_Fl_Widget.type_;
  t = (Fl_Boxtype)bVar9;
  if (uVar3 == '\x05') {
    Fl_Widget::draw_box((Fl_Widget *)this,t,iVar15,local_68,iVar10,H_01,0x31);
    uVar5 = (iVar10 - (iVar10 + -4 >> 0x1f)) - 4;
    iVar12 = ((int)uVar5 >> 1) + iVar15;
    iVar11 = local_68 + 2;
    W_00 = iVar10 - (uVar5 & 0xfffffffe);
    H_00 = H_01 + -4;
  }
  else {
    if (uVar3 != '\x04') {
      if (0 < H_01 && 0 < iVar10) {
        Fl_Widget::draw_box((Fl_Widget *)this,t,iVar15,local_68,iVar10,H_01,
                            (this->super_Fl_Valuator).super_Fl_Widget.color2_);
      }
      if (((((this->super_Fl_Valuator).super_Fl_Widget.type_ & 0xfe) != 2) &&
          (Fl::scheme_ != (char *)0x0)) && (iVar11 = strcmp("gtk+",Fl::scheme_), iVar11 == 0)) {
        if ((H < W) && (H_01 + 8 < iVar10)) {
          iVar11 = ((iVar10 - H_01) - ((iVar10 - H_01) + -4 >> 0x1f)) + -4 >> 1;
          iVar12 = iVar11 + iVar15;
          uVar6 = local_68 + 3;
          FVar7 = fl_color_average((this->super_Fl_Valuator).super_Fl_Widget.color2_,0x38,0.67);
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                    (fl_graphics_driver,(ulong)FVar7);
          uVar13 = (H_01 + local_68) - 5;
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xc])();
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xc])
                    (fl_graphics_driver,(ulong)(iVar11 + iVar15 + 6),uVar13,
                     (ulong)(uint)(H_01 + -2 + iVar12),(ulong)uVar6);
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xc])
                    (fl_graphics_driver,(ulong)(iVar15 + iVar11 + 0xc),uVar13,
                     (ulong)(uint)(H_01 + 4 + iVar12),(ulong)uVar6);
          FVar7 = fl_color_average((this->super_Fl_Valuator).super_Fl_Widget.color2_,0xff,0.67);
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                    (fl_graphics_driver,(ulong)FVar7);
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xc])
                    (fl_graphics_driver,(ulong)(iVar15 + iVar11 + 1),uVar13,
                     (ulong)((H_01 + iVar12) - 7),(ulong)uVar6);
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xc])
                    (fl_graphics_driver,(ulong)(iVar11 + iVar15 + 7),uVar13,
                     (ulong)(uint)(H_01 + -1 + iVar12),(ulong)uVar6);
          uVar14 = iVar11 + iVar15 + 0xd;
          uVar5 = H_01 + 5 + iVar12;
          pp_Var8 = (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device;
        }
        else {
          if ((H <= W) || (H_01 <= iVar10 + 8)) goto LAB_001bb258;
          uVar14 = iVar15 + 4;
          iVar11 = ((H_01 - iVar10) - ((H_01 - iVar10) + -4 >> 0x1f)) + -4 >> 1;
          iVar12 = iVar11 + local_68;
          FVar7 = fl_color_average((this->super_Fl_Valuator).super_Fl_Widget.color2_,0x38,0.67);
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                    (fl_graphics_driver,(ulong)FVar7);
          uVar5 = iVar10 + -4 + iVar15;
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xc])
                    (fl_graphics_driver,(ulong)uVar14,(ulong)((iVar12 + iVar10) - 8));
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xc])
                    (fl_graphics_driver,(ulong)uVar14,(ulong)(uint)(iVar10 + -2 + iVar12),uVar5,
                     (ulong)(local_68 + iVar11 + 6));
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xc])
                    (fl_graphics_driver,(ulong)uVar14,(ulong)(iVar12 + iVar10 + 4),uVar5,
                     (ulong)(uint)(iVar11 + 0xc + local_68));
          FVar7 = fl_color_average((this->super_Fl_Valuator).super_Fl_Widget.color2_,0xff,0.67);
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x11])
                    (fl_graphics_driver,(ulong)FVar7);
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xc])
                    (fl_graphics_driver,(ulong)uVar14,(ulong)((iVar12 + iVar10) - 7),(ulong)uVar5,
                     (ulong)(iVar11 + local_68 + 1));
          (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0xc])
                    (fl_graphics_driver,uVar14,(ulong)((iVar12 + iVar10) - 1),(ulong)uVar5,
                     (ulong)(uint)(iVar11 + 7 + local_68));
          uVar13 = iVar12 + iVar10 + 5;
          uVar6 = iVar11 + 0xd + local_68;
          pp_Var8 = (fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device;
        }
        (*pp_Var8[0xc])(fl_graphics_driver,(ulong)uVar14,(ulong)uVar13,(ulong)uVar5,(ulong)uVar6);
      }
      goto LAB_001bb258;
    }
    Fl_Widget::draw_box((Fl_Widget *)this,(uint)bVar9,iVar15,local_68,iVar10,H_01,0x31);
    uVar5 = (H_01 - (H_01 + -4 >> 0x1f)) - 4;
    iVar12 = iVar15 + 2;
    iVar11 = ((int)uVar5 >> 1) + local_68;
    W_00 = iVar10 + -4;
    H_00 = H_01 - (uVar5 & 0xfffffffe);
  }
  Fl_Widget::draw_box((Fl_Widget *)this,FL_THIN_DOWN_BOX,iVar12,iVar11,W_00,H_00,
                      (this->super_Fl_Valuator).super_Fl_Widget.color2_);
LAB_001bb258:
  Fl_Widget::draw_label((Fl_Widget *)this,iVar15,local_68,iVar10,H_01);
  if ((Fl_Slider *)Fl::focus_ == this) {
    if (((this->super_Fl_Valuator).super_Fl_Widget.type_ & 0xfe) == 2) {
      t = (Fl_Boxtype)(this->super_Fl_Valuator).super_Fl_Widget.box_;
      iVar15 = (this->super_Fl_Valuator).super_Fl_Widget.x_;
      local_68 = (this->super_Fl_Valuator).super_Fl_Widget.y_;
      iVar10 = (this->super_Fl_Valuator).super_Fl_Widget.w_;
      H_01 = (this->super_Fl_Valuator).super_Fl_Widget.h_;
    }
    Fl_Widget::draw_focus((Fl_Widget *)this,t,iVar15,local_68,iVar10,H_01);
    return;
  }
  return;
}

Assistant:

void Fl_Slider::draw(int X, int Y, int W, int H) {

  double val;
  if (minimum() == maximum())
    val = 0.5;
  else {
    val = (value()-minimum())/(maximum()-minimum());
    if (val > 1.0) val = 1.0;
    else if (val < 0.0) val = 0.0;
  }

  int ww = (horizontal() ? W : H);
  int xx, S;
  if (type()==FL_HOR_FILL_SLIDER || type() == FL_VERT_FILL_SLIDER) {
    S = int(val*ww+.5);
    if (minimum()>maximum()) {S = ww-S; xx = ww-S;}
    else xx = 0;
  } else {
    S = int(slider_size_*ww+.5);
    int T = (horizontal() ? H : W)/2+1;
    if (type()==FL_VERT_NICE_SLIDER || type()==FL_HOR_NICE_SLIDER) T += 4;
    if (S < T) S = T;
    xx = int(val*(ww-S)+.5);
  }
  int xsl, ysl, wsl, hsl;
  if (horizontal()) {
    xsl = X+xx;
    wsl = S;
    ysl = Y;
    hsl = H;
  } else {
    ysl = Y+xx;
    hsl = S;
    xsl = X;
    wsl = W;
  }

  draw_bg(X, Y, W, H);

  Fl_Boxtype box1 = slider();
  if (!box1) {box1 = (Fl_Boxtype)(box()&-2); if (!box1) box1 = FL_UP_BOX;}
  if (type() == FL_VERT_NICE_SLIDER) {
    draw_box(box1, xsl, ysl, wsl, hsl, FL_GRAY);
    int d = (hsl-4)/2;
    draw_box(FL_THIN_DOWN_BOX, xsl+2, ysl+d, wsl-4, hsl-2*d,selection_color());
  } else if (type() == FL_HOR_NICE_SLIDER) {
    draw_box(box1, xsl, ysl, wsl, hsl, FL_GRAY);
    int d = (wsl-4)/2;
    draw_box(FL_THIN_DOWN_BOX, xsl+d, ysl+2, wsl-2*d, hsl-4,selection_color());
  } else {
    if (wsl>0 && hsl>0) draw_box(box1, xsl, ysl, wsl, hsl, selection_color());

    if (type() != FL_HOR_FILL_SLIDER && type() != FL_VERT_FILL_SLIDER &&
        Fl::is_scheme("gtk+")) {
      if (W>H && wsl>(hsl+8)) {
        // Draw horizontal grippers
	int yy, hh;
	hh = hsl-8;
	xx = xsl+(wsl-hsl-4)/2;
	yy = ysl+3;

	fl_color(fl_darker(selection_color()));
	fl_line(xx, yy+hh, xx+hh, yy);
	fl_line(xx+6, yy+hh, xx+hh+6, yy);
	fl_line(xx+12, yy+hh, xx+hh+12, yy);

        xx++;
	fl_color(fl_lighter(selection_color()));
	fl_line(xx, yy+hh, xx+hh, yy);
	fl_line(xx+6, yy+hh, xx+hh+6, yy);
	fl_line(xx+12, yy+hh, xx+hh+12, yy);
      } else if (H>W && hsl>(wsl+8)) {
        // Draw vertical grippers
	int yy;
	xx = xsl+4;
	ww = wsl-8;
	yy = ysl+(hsl-wsl-4)/2;

	fl_color(fl_darker(selection_color()));
	fl_line(xx, yy+ww, xx+ww, yy);
	fl_line(xx, yy+ww+6, xx+ww, yy+6);
	fl_line(xx, yy+ww+12, xx+ww, yy+12);

        yy++;
	fl_color(fl_lighter(selection_color()));
	fl_line(xx, yy+ww, xx+ww, yy);
	fl_line(xx, yy+ww+6, xx+ww, yy+6);
	fl_line(xx, yy+ww+12, xx+ww, yy+12);
      }
    }
  }

  draw_label(xsl, ysl, wsl, hsl);
  if (Fl::focus() == this) {
    if (type() == FL_HOR_FILL_SLIDER || type() == FL_VERT_FILL_SLIDER) draw_focus();
    else draw_focus(box1, xsl, ysl, wsl, hsl);
  }
}